

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::AverageTestBase<unsigned_char>::SetUp
          (AverageTestBase<unsigned_char> *this)

{
  UnitTest *this_00;
  TestInfo *pTVar1;
  long lVar2;
  uchar *puVar3;
  SEARCH_METHODS *message;
  allocator local_61;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  AssertHelper local_38 [4];
  
  this_00 = testing::UnitTest::GetInstance();
  pTVar1 = testing::UnitTest::current_test_info(this_00);
  std::__cxx11::string::string
            ((string *)&gtest_ar,(pTVar1->test_suite_name_)._M_dataplus._M_p,(allocator *)&local_60)
  ;
  lVar2 = std::__cxx11::string::find(&gtest_ar.success_,0xb5b2c6);
  if (lVar2 == 0) {
    std::__cxx11::string::string((string *)local_38,(pTVar1->name_)._M_dataplus._M_p,&local_61);
    lVar2 = std::__cxx11::string::find((char *)local_38,0xa75680);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (lVar2 != -1) {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                (local_38,kSkip,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
                 ,0x3a,(char *)"");
      testing::internal::AssertHelper::operator=(local_38,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(local_38);
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (long *)0x0) {
        return;
      }
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      return;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  puVar3 = (uchar *)aom_memalign(0x10,0x4000);
  this->source_data_ = puVar3;
  local_38[0].data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((internal *)&gtest_ar,"source_data_","nullptr",&this->source_data_,&local_38[0].data_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_38);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x3f,(char *)message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_38[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_38[0].data_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    memset(this->source_data_,0,0x4000);
    this->source_stride_ = this->width_ + 0x1fU & 0xffffffe0;
    this->bit_depth_ = 8;
    this->rnd_ = (Random)0xbaba;
  }
  return;
}

Assistant:

void SetUp() override {
    const testing::TestInfo *const test_info =
        testing::UnitTest::GetInstance()->current_test_info();
    // Skip the speed test for C code as the baseline uses the same function.
    if (std::string(test_info->test_suite_name()).find("C/") == 0 &&
        std::string(test_info->name()).find("DISABLED_Speed") !=
            std::string::npos) {
      GTEST_SKIP();
    }

    source_data_ = static_cast<Pixel *>(
        aom_memalign(kDataAlignment, kDataBlockSize * sizeof(source_data_[0])));
    ASSERT_NE(source_data_, nullptr);
    memset(source_data_, 0, kDataBlockSize * sizeof(source_data_[0]));
    source_stride_ = (width_ + 31) & ~31;
    bit_depth_ = 8;
    rnd_.Reset(ACMRandom::DeterministicSeed());
  }